

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

t_object * __thiscall xemmai::t_parser::f_symbol(t_parser *this)

{
  t_script *this_00;
  wstring_view a_value;
  t_object *ptVar1;
  size_t unaff_RBX;
  wchar_t *unaff_retaddr;
  
  this_00 = this->v_module;
  a_value._M_str = unaff_retaddr;
  a_value._M_len = unaff_RBX;
  ptVar1 = t_symbol::f_instantiate(a_value);
  ptVar1 = t_script::f_slot(this_00,ptVar1);
  return ptVar1;
}

Assistant:

t_object* f_symbol() const
	{
		return v_module.f_slot(t_symbol::f_instantiate(v_lexer.f_value()));
	}